

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_prediction_degree_traverser.h
# Opt level: O1

bool __thiscall
draco::
MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
::TraverseFromCorner
          (MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           *this,CornerIndex corner_id)

{
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *this_00;
  ulong *puVar1;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *pvVar2;
  int iVar3;
  iterator iVar4;
  CornerTable *pCVar5;
  _Bit_type *p_Var6;
  ulong uVar7;
  MeshAttributeIndicesEncodingData *pMVar8;
  pointer pIVar9;
  pointer piVar10;
  uint uVar11;
  long lVar12;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar13;
  pointer *ppIVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  difference_type __n;
  ulong uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_48;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_44;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *local_40;
  pointer *local_38;
  
  if ((this->prediction_degree_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->prediction_degree_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = this->traversal_stacks_;
    iVar4._M_current =
         this->traversal_stacks_[0].
         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_44.value_ = corner_id.value_;
    if (iVar4._M_current ==
        this->traversal_stacks_[0].
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
      ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  *)this_00,iVar4,&local_44);
    }
    else {
      (iVar4._M_current)->value_ = corner_id.value_;
      this->traversal_stacks_[0].
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    this->best_priority_ = 0;
    IVar13.value_ = local_44.value_;
    if (local_44.value_ != 0xffffffff) {
      IVar13.value_ = local_44.value_ - 2;
      if (0x55555555 < (local_44.value_ + 1) * -0x55555555) {
        IVar13.value_ = local_44.value_ + 1;
      }
    }
    pCVar5 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).corner_table_;
    uVar22 = 0xffffffff;
    uVar19 = 0xffffffff;
    if (IVar13.value_ != 0xffffffff) {
      uVar19 = (ulong)(pCVar5->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[IVar13.value_].value_;
    }
    IVar13.value_ = local_44.value_;
    if (local_44.value_ != 0xffffffff) {
      IVar13.value_ = ((local_44.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_44.value_;
    }
    uVar17 = 0xffffffff;
    if (IVar13.value_ != 0xffffffff) {
      uVar17 = (ulong)(pCVar5->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[IVar13.value_].value_;
    }
    p_Var6 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar7 = p_Var6[uVar19 >> 6];
    local_40 = this_00;
    if ((uVar7 >> (uVar19 & 0x3f) & 1) == 0) {
      p_Var6[uVar19 >> 6] = uVar7 | 1L << ((byte)uVar19 & 0x3f);
      local_48.value_ = local_44.value_;
      if (local_44.value_ != 0xffffffff) {
        local_48.value_ = local_44.value_ - 2;
        if (0x55555555 < (local_44.value_ + 1) * -0x55555555) {
          local_48.value_ = local_44.value_ + 1;
        }
      }
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)local_48.value_ / 3]._M_elems
                 [local_48.value_ % 3].value_);
      pMVar8 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.encoding_data_;
      iVar4._M_current =
           (pMVar8->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (pMVar8->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar8,iVar4,&local_48);
      }
      else {
        (iVar4._M_current)->value_ = local_48.value_;
        (pMVar8->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      pMVar8 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.encoding_data_;
      (pMVar8->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar19]
           = pMVar8->num_values;
      pMVar8->num_values = pMVar8->num_values + 1;
    }
    p_Var6 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar19 = p_Var6[uVar17 >> 6];
    if ((uVar19 >> (uVar17 & 0x3f) & 1) == 0) {
      p_Var6[uVar17 >> 6] = uVar19 | 1L << ((byte)uVar17 & 0x3f);
      local_48.value_ = local_44.value_;
      if (local_44.value_ != 0xffffffff) {
        local_48.value_ = ((local_44.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_44.value_;
      }
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)local_48.value_ / 3]._M_elems
                 [local_48.value_ % 3].value_);
      pMVar8 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.encoding_data_;
      iVar4._M_current =
           (pMVar8->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (pMVar8->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar8,iVar4,&local_48);
      }
      else {
        (iVar4._M_current)->value_ = local_48.value_;
        (pMVar8->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      pMVar8 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.encoding_data_;
      (pMVar8->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar17]
           = pMVar8->num_values;
      pMVar8->num_values = pMVar8->num_values + 1;
    }
    if ((ulong)local_44.value_ != 0xffffffff) {
      uVar22 = (ulong)(((this->
                        super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                        ).corner_table_)->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_44.value_].value_;
    }
    p_Var6 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar19 = p_Var6[uVar22 >> 6];
    if ((uVar19 >> (uVar22 & 0x3f) & 1) == 0) {
      p_Var6[uVar22 >> 6] = uVar19 | 1L << ((byte)uVar22 & 0x3f);
      local_48.value_ = local_44.value_;
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)local_44.value_ / 3]._M_elems
                 [local_44.value_ % 3].value_);
      pMVar8 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.encoding_data_;
      iVar4._M_current =
           (pMVar8->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (pMVar8->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar8,iVar4,&local_48);
      }
      else {
        (iVar4._M_current)->value_ = local_48.value_;
        (pMVar8->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      pMVar8 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.encoding_data_;
      (pMVar8->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar22]
           = pMVar8->num_values;
      pMVar8->num_values = pMVar8->num_values + 1;
    }
    local_38 = &this->traversal_stacks_[0].
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
LAB_0012b97b:
    iVar20 = this->best_priority_;
    lVar12 = (long)iVar20;
    local_44.value_ = 0xffffffff;
    if (lVar12 < 3) {
      ppIVar14 = local_38 + lVar12 * 3;
      lVar15 = 0;
      do {
        pIVar9 = *ppIVar14;
        if (((_Vector_impl_data *)(ppIVar14 + -1))->_M_start != pIVar9) {
          local_44.value_ = pIVar9[-1].value_;
          *ppIVar14 = pIVar9 + -1;
          this->best_priority_ = iVar20 - (int)lVar15;
          break;
        }
        lVar15 = lVar15 + -1;
        ppIVar14 = ppIVar14 + 3;
      } while (lVar12 + -3 != lVar15);
    }
    if (local_44.value_ != 0xffffffff) {
      if ((*(ulong *)((long)(this->
                            super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                            ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     (ulong)(local_44.value_ / 0x18 & 0xfffffff8)) >>
           ((ulong)local_44.value_ / 3 & 0x3f) & 1) == 0) {
        do {
          uVar22 = (ulong)local_44.value_;
          uVar19 = uVar22 / 3;
          puVar1 = (ulong *)((long)(this->
                                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                   ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data._M_start.
                                   super__Bit_iterator_base._M_p +
                            (ulong)(local_44.value_ / 0x18 & 0xfffffff8));
          *puVar1 = *puVar1 | 1L << ((byte)uVar19 & 0x3f);
          uVar17 = 0xffffffff;
          if (uVar22 != 0xffffffff) {
            uVar17 = (ulong)(((this->
                              super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                              ).corner_table_)->corner_to_vertex_map_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar22].value_;
          }
          p_Var6 = (this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar22 = p_Var6[uVar17 >> 6];
          if ((uVar22 >> (uVar17 & 0x3f) & 1) == 0) {
            p_Var6[uVar17 >> 6] = uVar22 | 1L << ((byte)uVar17 & 0x3f);
            local_48.value_ = local_44.value_;
            PointsSequencer::AddPointId
                      ((this->
                       super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                       ).traversal_observer_.sequencer_,
                       (PointIndex)
                       (((this->
                         super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                         ).traversal_observer_.mesh_)->faces_).vector_.
                       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_elems
                       [local_44.value_ + (int)uVar19 * -3].value_);
            pMVar8 = (this->
                     super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                     ).traversal_observer_.encoding_data_;
            iVar4._M_current =
                 (pMVar8->encoded_attribute_value_index_to_corner_map).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (pMVar8->encoded_attribute_value_index_to_corner_map).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                        ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                          *)pMVar8,iVar4,&local_48);
            }
            else {
              (iVar4._M_current)->value_ = local_48.value_;
              (pMVar8->encoded_attribute_value_index_to_corner_map).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            pMVar8 = (this->
                     super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                     ).traversal_observer_.encoding_data_;
            (pMVar8->vertex_to_encoded_attribute_value_index_map).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar17] = pMVar8->num_values;
            pMVar8->num_values = pMVar8->num_values + 1;
          }
          pCVar5 = (this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).corner_table_;
          uVar19 = 0xffffffff;
          uVar16 = 0xffffffff;
          if (local_44.value_ != 0xffffffff) {
            uVar16 = local_44.value_ - 2;
            if (0x55555555 < (local_44.value_ + 1) * -0x55555555) {
              uVar16 = local_44.value_ + 1;
            }
            if (uVar16 != 0xffffffff) {
              uVar16 = (pCVar5->opposite_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].value_;
            }
          }
          if (local_44.value_ != 0xffffffff) {
            uVar11 = ((local_44.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_44.value_;
            uVar19 = (ulong)uVar11;
            if (uVar11 != 0xffffffff) {
              uVar19 = (ulong)(pCVar5->opposite_corners_).vector_.
                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].value_;
            }
          }
          local_48.value_ = (uint)uVar19;
          uVar22 = uVar19 / 3;
          if (local_48.value_ == 0xffffffff) {
            uVar22 = uVar19;
          }
          if (uVar16 == 0xffffffff) {
            bVar23 = true;
          }
          else {
            bVar23 = (*(ulong *)((long)(this->
                                       super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                       ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>
                                       ._M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p +
                                (ulong)(uVar16 / 0x18 & 0xfffffff8)) >> ((ulong)uVar16 / 3 & 0x3f) &
                     1) != 0;
          }
          if ((local_48.value_ == 0xffffffff) ||
             (((this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar22 >> 6] >>
               (uVar22 & 0x3f) & 1) != 0)) {
LAB_0012bc47:
            if (!bVar23) {
              uVar19 = 0xffffffff;
              if (uVar16 != 0xffffffff) {
                uVar19 = (ulong)(((this->
                                  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                  ).corner_table_)->corner_to_vertex_map_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar16].value_;
              }
              uVar22 = 0;
              if (((this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar19 >> 6] >>
                   (uVar19 & 0x3f) & 1) == 0) {
                piVar10 = (this->prediction_degree_).vector_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar20 = piVar10[uVar19];
                piVar10[uVar19] = iVar20 + 1;
                uVar22 = (ulong)((iVar20 < 1) + 1);
              }
              iVar3 = this->best_priority_;
              iVar21 = (int)uVar22;
              if (iVar3 < iVar21) {
                pvVar2 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                          *)(local_40 + uVar22);
                iVar4._M_current =
                     *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 8);
                if (iVar4._M_current ==
                    *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 0x10)) {
                  local_48.value_ = uVar16;
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                            (pvVar2,iVar4,&local_48);
                }
                else {
                  (iVar4._M_current)->value_ = uVar16;
                  *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 8) =
                       iVar4._M_current + 1;
                }
                if (iVar21 < this->best_priority_) {
                  this->best_priority_ = iVar21;
                }
                iVar20 = 0;
              }
              else {
                iVar20 = 4;
                local_44.value_ = uVar16;
              }
              if (iVar21 <= iVar3) goto LAB_0012bd01;
            }
            iVar20 = 5;
          }
          else {
            uVar22 = 0xffffffff;
            if (local_48.value_ != 0xffffffff) {
              uVar22 = (ulong)(pCVar5->corner_to_vertex_map_).vector_.
                              super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19].value_;
            }
            uVar19 = 0;
            if (((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar22 >> 6] >>
                 (uVar22 & 0x3f) & 1) == 0) {
              piVar10 = (this->prediction_degree_).vector_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar20 = piVar10[uVar22];
              piVar10[uVar22] = iVar20 + 1;
              uVar19 = (ulong)((iVar20 < 1) + 1);
            }
            iVar20 = (int)uVar19;
            bVar18 = (bool)(iVar20 <= this->best_priority_ & bVar23);
            if (bVar18) {
              iVar20 = 4;
              local_44.value_ = local_48.value_;
            }
            else {
              pvVar2 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                        *)(local_40 + uVar19);
              iVar4._M_current =
                   *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 8);
              if (iVar4._M_current ==
                  *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 0x10)) {
                std::
                vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                ::
                _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                          (pvVar2,iVar4,&local_48);
              }
              else {
                (iVar4._M_current)->value_ = local_48.value_;
                *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 8) =
                     iVar4._M_current + 1;
              }
              if (iVar20 < this->best_priority_) {
                this->best_priority_ = iVar20;
              }
              iVar20 = 0;
            }
            if (!bVar18) goto LAB_0012bc47;
          }
LAB_0012bd01:
        } while (iVar20 == 4);
      }
      goto LAB_0012b97b;
    }
  }
  return true;
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (prediction_degree_.size() == 0) {
      return true;
    }

    // Traversal starts from the |corner_id|. It's going to follow either the
    // right or the left neighboring faces to |corner_id| based on their
    // prediction degree.
    traversal_stacks_[0].push_back(corner_id);
    best_priority_ = 0;
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }
    const VertexIndex tip_vertex = this->corner_table()->Vertex(corner_id);
    if (!this->IsVertexVisited(tip_vertex)) {
      this->MarkVertexVisited(tip_vertex);
      this->traversal_observer().OnNewVertexVisited(tip_vertex, corner_id);
    }
    // Start the actual traversal.
    while ((corner_id = PopNextCornerToTraverse()) != kInvalidCornerIndex) {
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        continue;
      }

      while (true) {
        face_id = FaceIndex(corner_id.value() / 3);
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);

        // If the newly reached vertex hasn't been visited, mark it and notify
        // the observer.
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (!this->IsVertexVisited(vert_id)) {
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
        }

        // Check whether we can traverse to the right and left neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        const bool is_right_face_visited = this->IsFaceVisited(right_face_id);
        const bool is_left_face_visited = this->IsFaceVisited(left_face_id);

        if (!is_left_face_visited) {
          // We can go to the left face.
          const int priority = ComputePriority(left_corner_id);
          if (is_right_face_visited && priority <= best_priority_) {
            // Right face has been already visited and the priority is equal or
            // better than the best priority. We are sure that the left face
            // would be traversed next so there is no need to put it onto the
            // stack.
            corner_id = left_corner_id;
            continue;
          } else {
            AddCornerToTraversalStack(left_corner_id, priority);
          }
        }
        if (!is_right_face_visited) {
          // Go to the right face.
          const int priority = ComputePriority(right_corner_id);
          if (priority <= best_priority_) {
            // We are sure that the right face would be traversed next so there
            // is no need to put it onto the stack.
            corner_id = right_corner_id;
            continue;
          } else {
            AddCornerToTraversalStack(right_corner_id, priority);
          }
        }

        // Couldn't proceed directly to the next corner
        break;
      }
    }
    return true;
  }